

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_gen_key(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uint nbits,int exponent)

{
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  mbedtls_mpi *X_02;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ulong nbits_00;
  mbedtls_mpi L;
  mbedtls_mpi G;
  mbedtls_mpi H;
  
  iVar2 = -0x4080;
  if (((((nbits & 1) == 0) && (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0)) &&
      (0x7f < nbits)) && (2 < exponent)) {
    mbedtls_mpi_init(&H);
    mbedtls_mpi_init(&G);
    mbedtls_mpi_init(&L);
    X = &ctx->E;
    iVar2 = mbedtls_mpi_lset(X,(ulong)(uint)exponent);
    if (iVar2 == 0) {
      X_00 = &ctx->P;
      nbits_00 = (ulong)(nbits >> 1);
      X_01 = &ctx->Q;
      uVar1 = (nbits >> 1) - 99;
      if (nbits < 200) {
        uVar1 = 0;
      }
      X_02 = &ctx->D;
      do {
        do {
          do {
            iVar2 = mbedtls_mpi_gen_prime(X_00,nbits_00,0,f_rng,p_rng);
            if (((iVar2 != 0) ||
                (iVar2 = mbedtls_mpi_gen_prime(X_01,nbits_00,0,f_rng,p_rng), iVar2 != 0)) ||
               (iVar2 = mbedtls_mpi_sub_mpi(&H,X_00,X_01), iVar2 != 0)) goto LAB_0010c96e;
            sVar3 = mbedtls_mpi_bitlen(&H);
          } while (sVar3 <= uVar1);
          if (H.s < 0) {
            mbedtls_mpi_swap(X_00,X_01);
          }
          iVar2 = mbedtls_mpi_sub_int(X_00,X_00,1);
          if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_sub_int(X_01,X_01,1), iVar2 != 0)) ||
             (iVar2 = mbedtls_mpi_mul_mpi(&H,X_00,X_01), iVar2 != 0)) goto LAB_0010c96e;
          iVar2 = mbedtls_mpi_gcd(&G,X,&H);
          if (iVar2 != 0) goto LAB_0010c96e;
          iVar2 = mbedtls_mpi_cmp_int(&G,1);
        } while (iVar2 != 0);
        iVar2 = mbedtls_mpi_gcd(&G,X_00,X_01);
        if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_div_mpi(&L,(mbedtls_mpi *)0x0,&H,&G), iVar2 != 0))
           || (iVar2 = mbedtls_mpi_inv_mod(X_02,X,&L), iVar2 != 0)) goto LAB_0010c96e;
        sVar3 = mbedtls_mpi_bitlen(X_02);
      } while (sVar3 <= nbits_00);
      iVar2 = mbedtls_mpi_add_int(X_00,X_00,1);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_add_int(X_01,X_01,1), iVar2 == 0)) {
        iVar2 = mbedtls_mpi_mul_mpi(&ctx->N,X_00,X_01);
        if (iVar2 == 0) {
          sVar3 = mbedtls_mpi_size(&ctx->N);
          ctx->len = sVar3;
          iVar2 = mbedtls_rsa_deduce_crt(X_00,X_01,X_02,&ctx->DP,&ctx->DQ,&ctx->QP);
          if (iVar2 == 0) {
            iVar2 = mbedtls_rsa_check_privkey(ctx);
          }
        }
      }
    }
LAB_0010c96e:
    mbedtls_mpi_free(&H);
    mbedtls_mpi_free(&G);
    mbedtls_mpi_free(&L);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      mbedtls_rsa_free(ctx);
      iVar2 = iVar2 + -0x4180;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_gen_key( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 unsigned int nbits, int exponent )
{
    int ret;
    mbedtls_mpi H, G, L;

    if( f_rng == NULL || nbits < 128 || exponent < 3 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( nbits % 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_mpi_init( &H );
    mbedtls_mpi_init( &G );
    mbedtls_mpi_init( &L );

    /*
     * find primes P and Q with Q < P so that:
     * 1.  |P-Q| > 2^( nbits / 2 - 100 )
     * 2.  GCD( E, (P-1)*(Q-1) ) == 1
     * 3.  E^-1 mod LCM(P-1, Q-1) > 2^( nbits / 2 )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &ctx->E, exponent ) );

    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->P, nbits >> 1, 0,
                                                f_rng, p_rng ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->Q, nbits >> 1, 0,
                                                f_rng, p_rng ) );

        /* make sure the difference between p and q is not too small (FIPS 186-4 §B.3.3 step 5.4) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &H, &ctx->P, &ctx->Q ) );
        if( mbedtls_mpi_bitlen( &H ) <= ( ( nbits >= 200 ) ? ( ( nbits >> 1 ) - 99 ) : 0 ) )
            continue;

        /* not required by any standards, but some users rely on the fact that P > Q */
        if( H.s < 0 )
            mbedtls_mpi_swap( &ctx->P, &ctx->Q );

        /* Temporarily replace P,Q by P-1, Q-1 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &ctx->P, &ctx->P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &ctx->Q, &ctx->Q, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &ctx->P, &ctx->Q ) );

        /* check GCD( E, (P-1)*(Q-1) ) == 1 (FIPS 186-4 §B.3.1 criterion 2(a)) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->E, &H  ) );
        if( mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
            continue;

        /* compute smallest possible D = E^-1 mod LCM(P-1, Q-1) (FIPS 186-4 §B.3.1 criterion 3(b)) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->P, &ctx->Q ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &L, NULL, &H, &G ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->D, &ctx->E, &L ) );

        if( mbedtls_mpi_bitlen( &ctx->D ) <= ( ( nbits + 1 ) / 2 ) ) // (FIPS 186-4 §B.3.1 criterion 3(a))
            continue;

        break;
    }
    while( 1 );

    /* Restore P,Q */
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &ctx->P,  &ctx->P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &ctx->Q,  &ctx->Q, 1 ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->N, &ctx->P, &ctx->Q ) );

    ctx->len = mbedtls_mpi_size( &ctx->N );

#if !defined(MBEDTLS_RSA_NO_CRT)
    /*
     * DP = D mod (P - 1)
     * DQ = D mod (Q - 1)
     * QP = Q^-1 mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_rsa_deduce_crt( &ctx->P, &ctx->Q, &ctx->D,
                                             &ctx->DP, &ctx->DQ, &ctx->QP ) );
#endif /* MBEDTLS_RSA_NO_CRT */

    /* Double-check */
    MBEDTLS_MPI_CHK( mbedtls_rsa_check_privkey( ctx ) );

cleanup:

    mbedtls_mpi_free( &H );
    mbedtls_mpi_free( &G );
    mbedtls_mpi_free( &L );

    if( ret != 0 )
    {
        mbedtls_rsa_free( ctx );
        return( MBEDTLS_ERR_RSA_KEY_GEN_FAILED + ret );
    }

    return( 0 );
}